

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O3

int __thiscall gl4cts::GL43TestPackage::init(GL43TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  BlendEquationAdvancedTests *this_00;
  ShaderBitfieldOperationTests *this_01;
  
  GL42TestPackage::init(&this->super_GL42TestPackage,ctx);
  pTVar1 = (TestNode *)operator_new(0x78);
  ::glcts::ArrayOfArraysTestGroupGL::ArrayOfArraysTestGroupGL
            ((ArrayOfArraysTestGroupGL *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  CopyImageTests::CopyImageTests
            ((CopyImageTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ::glcts::DrawIndirectTestsGL43::DrawIndirectTestsGL43
            ((DrawIndirectTestsGL43 *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  KHRDebugTests::KHRDebugTests
            ((KHRDebugTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ProgramInterfaceQueryTests::ProgramInterfaceQueryTests
            ((ProgramInterfaceQueryTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ComputeShaderTests::ComputeShaderTests
            ((ComputeShaderTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  deqp::RobustBufferAccessBehaviorTests::RobustBufferAccessBehaviorTests
            ((RobustBufferAccessBehaviorTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderStorageBufferObjectTests::ShaderStorageBufferObjectTests
            ((ShaderStorageBufferObjectTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexAttribBindingTests::VertexAttribBindingTests
            ((VertexAttribBindingTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderImageSizeTests::ShaderImageSizeTests
            ((ShaderImageSizeTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ::glcts::ExplicitUniformLocationGLTests::ExplicitUniformLocationGLTests
            ((ExplicitUniformLocationGLTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (BlendEquationAdvancedTests *)operator_new(0x80);
  ::glcts::BlendEquationAdvancedTests::BlendEquationAdvancedTests
            (this_00,&(*(PackageContext **)
                        ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.
                                super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                                super_GL31TestPackage.super_GL30TestPackage + 0x78))->m_context,
             GLSL_VERSION_430);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (ShaderBitfieldOperationTests *)operator_new(0x80);
  ::glcts::ShaderBitfieldOperationTests::ShaderBitfieldOperationTests
            (this_01,&(*(PackageContext **)
                        ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.
                                super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                                super_GL31TestPackage.super_GL30TestPackage + 0x78))->m_context,
             GLSL_VERSION_430);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TestNode *)operator_new(0x78);
  StencilTexturingTests::StencilTexturingTests
            ((StencilTexturingTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SparseBufferTests::SparseBufferTests
            ((SparseBufferTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SparseTextureTests::SparseTextureTests
            ((SparseTextureTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL42TestPackage).super_GL41TestPackage.super_GL40TestPackage.
                        super_GL33TestPackage.super_GL32TestPackage.super_GL31TestPackage.
                        super_GL30TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void GL43TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL42TestPackage::init();

	try
	{
		addChild(new glcts::ArrayOfArraysTestGroupGL(getContext()));
		addChild(new gl4cts::CopyImageTests(getContext()));
		addChild(new glcts::DrawIndirectTestsGL43(getContext()));
		addChild(new gl4cts::KHRDebugTests(getContext()));
		addChild(new gl4cts::ProgramInterfaceQueryTests(getContext()));
		addChild(new gl4cts::ComputeShaderTests(getContext()));
		addChild(new deqp::RobustBufferAccessBehaviorTests(getContext()));
		addChild(new gl4cts::ShaderStorageBufferObjectTests(getContext()));
		addChild(new gl4cts::VertexAttribBindingTests(getContext()));
		addChild(new gl4cts::ShaderImageSizeTests(getContext()));
		addChild(new glcts::ExplicitUniformLocationGLTests(getContext()));
		addChild(new glcts::BlendEquationAdvancedTests(getContext(), glu::GLSL_VERSION_430));
		addChild(new glcts::ShaderBitfieldOperationTests(getContext(), glu::GLSL_VERSION_430));
		addChild(new gl4cts::StencilTexturingTests(getContext()));
		addChild(new gl4cts::SparseBufferTests(getContext()));
		addChild(new gl4cts::SparseTextureTests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}